

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
          (ColorBlendState *this,ColorBlendState *createInfo,
          vector<float,_std::allocator<float>_> *_blendConstants)

{
  VkPipelineColorBlendAttachmentState *__first;
  pointer pVVar1;
  pointer pfVar2;
  undefined8 uVar3;
  VkBool32 VVar4;
  allocator_type local_19;
  
  __first = (createInfo->super_VkPipelineColorBlendStateCreateInfo).pAttachments;
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&this->m_attachments,__first,
             __first + (createInfo->super_VkPipelineColorBlendStateCreateInfo).attachmentCount,
             &local_19);
  (this->super_VkPipelineColorBlendStateCreateInfo).sType =
       (createInfo->super_VkPipelineColorBlendStateCreateInfo).sType;
  (this->super_VkPipelineColorBlendStateCreateInfo).pNext =
       (createInfo->super_VkPipelineColorBlendStateCreateInfo).pNext;
  VVar4 = (createInfo->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable;
  (this->super_VkPipelineColorBlendStateCreateInfo).flags =
       (createInfo->super_VkPipelineColorBlendStateCreateInfo).flags;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable = VVar4;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOp =
       (createInfo->super_VkPipelineColorBlendStateCreateInfo).logicOp;
  pVVar1 = (this->m_attachments).
           super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineColorBlendStateCreateInfo).attachmentCount =
       (deUint32)
       ((ulong)((long)(this->m_attachments).
                      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 5);
  (this->super_VkPipelineColorBlendStateCreateInfo).pAttachments = pVVar1;
  pfVar2 = (_blendConstants->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)(pfVar2 + 2);
  *(undefined8 *)(this->super_VkPipelineColorBlendStateCreateInfo).blendConstants =
       *(undefined8 *)pfVar2;
  *(undefined8 *)((this->super_VkPipelineColorBlendStateCreateInfo).blendConstants + 2) = uVar3;
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::ColorBlendState (const ColorBlendState& createInfo, std::vector<float> _blendConstants)
	: m_attachments (createInfo.pAttachments, createInfo.pAttachments + createInfo.attachmentCount)
{
	sType = createInfo.sType;
	pNext = createInfo.pNext;
	flags					= createInfo.flags;
	logicOpEnable			= createInfo.logicOpEnable;
	logicOp					= createInfo.logicOp;
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachments[0];
	deMemcpy(blendConstants, &_blendConstants[0], 4 * sizeof(float));
}